

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void __thiscall
ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
LineSegmentsRenderer
          (LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
           *this,GetterYs<int> *getter1,GetterYRef *getter2,TransformerLogLog *transformer,ImU32 col
          ,float weight)

{
  int iVar1;
  float weight_local;
  ImU32 col_local;
  TransformerLogLog *transformer_local;
  GetterYRef *getter2_local;
  GetterYs<int> *getter1_local;
  LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
  *this_local;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar1 = ImMin<int>(this->Getter1->Count,this->Getter2->Count);
  this->Prims = iVar1;
  this->Col = col;
  this->Weight = weight;
  return;
}

Assistant:

inline LineSegmentsRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col, float weight) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count)),
        Col(col),
        Weight(weight)
    {}